

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O0

void Unit_Test::fillImage
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  byte bVar1;
  uint32_t uVar2;
  uchar *puVar3;
  size_type sVar4;
  uchar *puVar5;
  size_type sVar6;
  const_reference pvVar7;
  uchar *puVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_R9;
  uint8_t *endX;
  uint8_t *outputX;
  size_t id;
  size_t valueSize;
  uint8_t *endY;
  uint8_t *outputY;
  uint32_t rowSize;
  uint32_t in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  size_type local_48;
  uchar *local_30;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
            );
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  local_30 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
  local_30 = local_30 + (ulong)(in_ESI * (uint)bVar1) + (ulong)(in_EDX * uVar2);
  puVar3 = local_30 + uVar2 * in_R8D;
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_R9);
  local_48 = 0;
  for (; local_30 != puVar3; local_30 = local_30 + uVar2) {
    puVar5 = local_30 + in_ECX * (uint)bVar1;
    for (puVar8 = local_30; puVar8 != puVar5; puVar8 = puVar8 + 1) {
      sVar6 = local_48 + 1;
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_R9,local_48);
      *puVar8 = *pvVar7;
      local_48 = sVar6;
      if (sVar6 == sVar4) {
        local_48 = 0;
      }
    }
  }
  return;
}

Assistant:

void fillImage( PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                    const std::vector < uint8_t > & value )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );

        const uint32_t rowSize = image.rowSize();
        uint8_t * outputY      = image.data() + y * rowSize + x * image.colorCount();
        const uint8_t * endY   = outputY + rowSize * height;

        width = width * image.colorCount();
        const size_t valueSize = value.size();

        size_t id = 0;

        for ( ; outputY != endY; outputY += rowSize ) {
            uint8_t * outputX    = outputY;
            const uint8_t * endX = outputX + width;

            for( ; outputX != endX; ++outputX ) {
                (*outputX) = value[id++];
                if ( id == valueSize )
                    id = 0;
            }
        }
    }